

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void update_perf_tbl_with_cptp_json_perf_data(AppCtx *ctx,PerfProfRunHandle *handle)

{
  double dVar1;
  cJSON *root;
  PerfProfRun run;
  PerfProfRun local_68;
  
  dVar1 = ctx->current_batch->timelimit;
  strncpy(local_68.solver_name,handle->solver_name,0x30);
  local_68.solver_name[0x2f] = '\0';
  local_68.solution.stats[0] = dVar1 + dVar1;
  local_68.solution.status = SOLVE_STATUS_ERR;
  local_68.solution._4_4_ = 0;
  local_68.solution.stats[1] = 2.0;
  local_68.solution.stats[2] = 0.0;
  if (handle->json_output_path[0] != '\0') {
    root = load_json(handle->json_output_path);
    if (root != (cJSON *)0x0) {
      parse_cptp_solver_json_dump(&local_68,root);
      cJSON_Delete(root);
    }
  }
  store_perfprof_run(&ctx->perf_tbl,&(handle->input).uid,&local_68);
  return;
}

Assistant:

static void
update_perf_tbl_with_cptp_json_perf_data(AppCtx *ctx,
                                         PerfProfRunHandle *handle) {
    PerfProfRun run = make_solver_run(ctx->current_batch, handle->solver_name);
    if (handle->json_output_path[0] != '\0') {
        cJSON *root = load_json(handle->json_output_path);
        if (root) {
            parse_cptp_solver_json_dump(&run, root);
            cJSON_Delete(root);
        }
    }
    store_perfprof_run(&ctx->perf_tbl, &handle->input.uid, &run);
}